

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RangeTokenMap.cpp
# Opt level: O2

void __thiscall xercesc_4_0::RangeTokenMap::buildTokenRanges(RangeTokenMap *this)

{
  RangeFactory *pRVar1;
  undefined8 extraout_RDX;
  
  pRVar1 = RefHashTableOf<xercesc_4_0::RangeFactory,_xercesc_4_0::StringHasher>::get
                     (this->fRangeMap,&fgXMLCategory);
  (*pRVar1->_vptr_RangeFactory[3])(pRVar1,this);
  pRVar1 = RefHashTableOf<xercesc_4_0::RangeFactory,_xercesc_4_0::StringHasher>::get
                     (this->fRangeMap,fgASCIICategory);
  (*pRVar1->_vptr_RangeFactory[3])(pRVar1,this);
  pRVar1 = RefHashTableOf<xercesc_4_0::RangeFactory,_xercesc_4_0::StringHasher>::get
                     (this->fRangeMap,fgUnicodeCategory);
  (*pRVar1->_vptr_RangeFactory[3])(pRVar1,this);
  pRVar1 = RefHashTableOf<xercesc_4_0::RangeFactory,_xercesc_4_0::StringHasher>::get
                     (this->fRangeMap,fgBlockCategory);
  (*pRVar1->_vptr_RangeFactory[3])(pRVar1,this,extraout_RDX,pRVar1->_vptr_RangeFactory[3]);
  return;
}

Assistant:

void RangeTokenMap::buildTokenRanges()
{
    // Build ranges */
    RangeFactory* rangeFactory = fRangeMap->get(fgXMLCategory);
    rangeFactory->buildRanges(this);

    rangeFactory = fRangeMap->get(fgASCIICategory);
    rangeFactory->buildRanges(this);

    rangeFactory = fRangeMap->get(fgUnicodeCategory);
    rangeFactory->buildRanges(this);

    rangeFactory = fRangeMap->get(fgBlockCategory);
    rangeFactory->buildRanges(this);
}